

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
     ::transfer_slot_fn(void *set,void *dst,void *src)

{
  size_t c;
  
  c = *set;
  *(undefined8 *)set = 0xffffffffffffff9c;
  *(undefined8 *)dst = *src;
  *(undefined8 *)((long)dst + 8) = *(undefined8 *)((long)src + 8);
  *(undefined8 *)((long)src + 8) = 0;
  CommonFields::set_capacity((CommonFields *)set,c);
  return;
}

Assistant:

size_t capacity() const { return capacity_; }